

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carLot.cpp
# Opt level: O1

int main(void)

{
  long *plVar1;
  int choice;
  vector<Car,_std::allocator<Car>_> cars;
  int local_4c;
  vector<Car,_std::allocator<Car>_> local_48;
  
  local_48.super__Vector_base<Car,_std::allocator<Car>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<Car,_std::allocator<Car>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<Car,_std::allocator<Car>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  do {
    local_4c = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Welcome to the car inventory system!",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Please chose a number:",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    plVar1 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1) Add car",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"2) List inventory",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"3) Display profit",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"4) Quit",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Choice [1-4]: ",0xe);
    std::istream::operator>>((istream *)&std::cin,&local_4c);
    switch(local_4c) {
    case 1:
      AddCar(&local_48);
      break;
    case 2:
      PrintInventory(&local_48);
      break;
    case 3:
      CalculateProfit(&local_48);
      break;
    case 4:
      exit(0);
    }
  } while( true );
}

Assistant:

int main()
{
    vector<Car> cars;

    do
    {
        int choice = 0;

        cout << "Welcome to the car inventory system!" << endl;
        cout << "Please chose a number:" << endl << endl;
        cout << "1) Add car" << endl;
        cout << "2) List inventory" << endl;
        cout << "3) Display profit" << endl;
        cout << "4) Quit" << endl;
        cout << "Choice [1-4]: ";

        cin >> choice;

        switch(choice)
        {
            case 1:
                AddCar(cars);
                break;
            case 2:
                PrintInventory(cars);
                break;
            case 3:
                CalculateProfit(cars);
                break;
            case 4:
                exit(0);
            default:
                break;
        }

    }
    while(true);

    return 0;
}